

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_xsrqpi(CPUPPCState_conflict *env,uint32_t opcode,ppc_vsr_t *xt,ppc_vsr_t *xb)

{
  float128 arg;
  uint32_t uVar1;
  int iVar2;
  float128 fVar3;
  uintptr_t unaff_retaddr;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  float_status local_44;
  float_status tstat;
  uint8_t rmode;
  uint8_t rmc;
  uint8_t ex;
  uint8_t r;
  ppc_vsr_t t;
  ppc_vsr_t *xb_local;
  ppc_vsr_t *xt_local;
  uint32_t opcode_local;
  CPUPPCState_conflict *env_local;
  
  memset(&tstat.flush_to_zero,0,0x10);
  uVar1 = Rrm(opcode);
  tstat.floatx80_rounding_precision = (char)uVar1;
  uVar1 = Rc(opcode);
  tstat.float_exception_flags = (uint8_t)uVar1;
  uVar1 = RMC(opcode);
  tstat.float_rounding_mode = (char)uVar1;
  tstat.float_detect_tininess = '\0';
  helper_reset_fpstatus(env);
  if ((tstat.floatx80_rounding_precision == '\0') && (tstat.float_rounding_mode == '\0')) {
    tstat.float_detect_tininess = '\x04';
  }
  else if ((tstat.floatx80_rounding_precision == '\0') && (tstat.float_rounding_mode == '\x03')) {
    tstat.float_detect_tininess = (byte)env->fpscr & 3;
  }
  else if (tstat.floatx80_rounding_precision == '\x01') {
    switch(tstat.float_rounding_mode) {
    case '\0':
      tstat.float_detect_tininess = '\0';
      break;
    case '\x01':
      tstat.float_detect_tininess = '\x03';
      break;
    case '\x02':
      tstat.float_detect_tininess = '\x02';
      break;
    case '\x03':
      tstat.float_detect_tininess = '\x01';
      break;
    default:
      abort();
    }
  }
  local_44 = env->fp_status;
  set_float_exception_flags(0,&local_44);
  set_float_rounding_mode((uint)(byte)tstat.float_detect_tininess,&local_44);
  fVar3 = float128_round_to_int_ppc(xb->f128,&local_44);
  local_58 = fVar3.low;
  stack0xffffffffffffffc8 = local_58;
  local_50 = fVar3.high;
  t.u64[0] = local_50;
  (env->fp_status).float_exception_flags =
       (env->fp_status).float_exception_flags | local_44.float_exception_flags;
  if ((((ulong)local_44 & 0x10000) != 0) &&
     (iVar2 = float128_is_signaling_nan_ppc(xb->f128,&local_44), iVar2 != 0)) {
    float_invalid_op_vxsnan(env,unaff_retaddr);
    fVar3.high = local_50;
    fVar3.low = stack0xffffffffffffffc8;
    fVar3 = float128_snan_to_qnan(fVar3);
    local_68 = fVar3.low;
    stack0xffffffffffffffc8 = local_68;
    local_60 = fVar3.high;
    t.u64[0] = local_60;
  }
  if ((tstat.float_exception_flags == '\0') && (((ulong)local_44 & 0x200000) != 0)) {
    (env->fp_status).float_exception_flags = (env->fp_status).float_exception_flags & 0xdf;
  }
  arg.high = t.u64[0];
  arg.low = stack0xffffffffffffffc8;
  helper_compute_fprf_float128(env,arg);
  do_float_check_status(env,unaff_retaddr);
  xt->u64[0] = stack0xffffffffffffffc8;
  xt->u64[1] = t.u64[0];
  return;
}

Assistant:

void helper_xsrqpi(CPUPPCState *env, uint32_t opcode,
                   ppc_vsr_t *xt, ppc_vsr_t *xb)
{
    ppc_vsr_t t = { 0 };
    uint8_t r = Rrm(opcode);
    uint8_t ex = Rc(opcode);
    uint8_t rmc = RMC(opcode);
    uint8_t rmode = 0;
    float_status tstat;

    helper_reset_fpstatus(env);

    if (r == 0 && rmc == 0) {
        rmode = float_round_ties_away;
    } else if (r == 0 && rmc == 0x3) {
        rmode = fpscr_rn;
    } else if (r == 1) {
        switch (rmc) {
        case 0:
            rmode = float_round_nearest_even;
            break;
        case 1:
            rmode = float_round_to_zero;
            break;
        case 2:
            rmode = float_round_up;
            break;
        case 3:
            rmode = float_round_down;
            break;
        default:
            abort();
        }
    }

    tstat = env->fp_status;
    set_float_exception_flags(0, &tstat);
    set_float_rounding_mode(rmode, &tstat);
    t.f128 = float128_round_to_int(xb->f128, &tstat);
    env->fp_status.float_exception_flags |= tstat.float_exception_flags;

    if (unlikely(tstat.float_exception_flags & float_flag_invalid)) {
        if (float128_is_signaling_nan(xb->f128, &tstat)) {
            float_invalid_op_vxsnan(env, GETPC());
            t.f128 = float128_snan_to_qnan(t.f128);
        }
    }

    if (ex == 0 && (tstat.float_exception_flags & float_flag_inexact)) {
        env->fp_status.float_exception_flags &= ~float_flag_inexact;
    }

    helper_compute_fprf_float128(env, t.f128);
    do_float_check_status(env, GETPC());
    *xt = t;
}